

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TDefaultGlslIoResolver::reserverResourceSlot
          (TDefaultGlslIoResolver *this,TVarEntryInfo *ent,TInfoSink *infoSink)

{
  undefined8 uVar1;
  TType *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SpvVersion *pSVar4;
  TQualifier *this_01;
  long lVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  char *s;
  undefined4 local_a4;
  uint local_9c;
  undefined1 local_90 [8];
  TString errorMsg;
  iterator iStack_60;
  int numBindings;
  int local_54;
  iterator iStack_50;
  int binding;
  iterator iter;
  TVarSlotMap *varSlotMap;
  uint local_38;
  int resourceKey;
  int set;
  TResourceType resource;
  TString *name;
  TType *type;
  TInfoSink *infoSink_local;
  TVarEntryInfo *ent_local;
  TDefaultGlslIoResolver *this_local;
  
  type = (TType *)infoSink;
  infoSink_local = (TInfoSink *)ent;
  ent_local = (TVarEntryInfo *)this;
  iVar3 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  name = (TString *)CONCAT44(extraout_var,iVar3);
  _set = (key_type *)(**(code **)(*(long *)(infoSink_local->info).sink._M_string_length + 0x1a0))();
  resourceKey = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver
                  [0x15])(this,name);
  pSVar4 = TIntermediate::getSpv((this->super_TDefaultIoResolverBase).referenceIntermediate);
  if (pSVar4->openGl == 0) {
    local_9c = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[4])
                         (this,(ulong)*(uint *)((long)&(infoSink_local->info).shaderFileName + 4),
                          infoSink_local);
  }
  else {
    local_9c = resourceKey;
  }
  local_38 = local_9c;
  varSlotMap._4_4_ = local_9c;
  this_01 = (TQualifier *)
            (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
  bVar2 = TQualifier::hasBinding(this_01);
  if (bVar2) {
    iter._M_node = (_Base_ptr)
                   std::
                   map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
                   ::operator[](&this->resourceSlotMap,(key_type_conflict1 *)((long)&varSlotMap + 4)
                               );
    iStack_50 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                        *)iter._M_node,_set);
    lVar5 = (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
    uVar1 = *(undefined8 *)(lVar5 + 0x1c);
    local_54 = TDefaultIoResolverBase::getBaseBinding
                         (&this->super_TDefaultIoResolverBase,
                          *(EShLanguage *)((long)&(infoSink_local->info).shaderFileName + 4),
                          resourceKey,local_38);
    local_54 = ((uint)((ulong)uVar1 >> 0x20) & 0xffff) + local_54;
    iStack_60 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                ::end(iter._M_node);
    bVar2 = std::operator==(&stack0xffffffffffffffb0,&stack0xffffffffffffffa0);
    if (bVar2) {
      pSVar4 = TIntermediate::getSpv((this->super_TDefaultIoResolverBase).referenceIntermediate);
      if ((pSVar4->openGl == 0) ||
         (uVar6 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[2].inUseList)(),
         (uVar6 & 1) == 0)) {
        local_a4 = 1;
      }
      else {
        local_a4 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].freeList)();
      }
      iVar3 = local_54;
      errorMsg.field_2._12_4_ = local_a4;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                             *)iter._M_node,_set);
      *pmVar7 = iVar3;
      TDefaultIoResolverBase::reserveSlot
                (&this->super_TDefaultIoResolverBase,varSlotMap._4_4_,local_54,
                 errorMsg.field_2._12_4_);
    }
    else {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>
               ::operator->(&stack0xffffffffffffffb0);
      if (ppVar8->second != local_54) {
        std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )local_90,"Invalid binding: ",_set);
        this_00 = type;
        s = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_90);
        TInfoSinkBase::message((TInfoSinkBase *)this_00,EPrefixInternalError,s);
        (this->super_TDefaultIoResolverBase).hasError = true;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_90);
      }
    }
  }
  return;
}

Assistant:

void TDefaultGlslIoResolver::reserverResourceSlot(TVarEntryInfo& ent, TInfoSink& infoSink) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    TResourceType resource = getResourceType(type);
    int set = referenceIntermediate.getSpv().openGl != 0 ? resource : resolveSet(ent.stage, ent);
    int resourceKey = set;

    if (type.getQualifier().hasBinding()) {
        TVarSlotMap& varSlotMap = resourceSlotMap[resourceKey];
        TVarSlotMap::iterator iter = varSlotMap.find(name);
        int binding = type.getQualifier().layoutBinding + getBaseBinding(ent.stage, resource, set);

        if (iter == varSlotMap.end()) {
            // Reserve the slots for the ubo, ssbo and opaques who has explicit binding
            int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
            varSlotMap[name] = binding;
            reserveSlot(resourceKey, binding, numBindings);
        } else {
            // Allocate binding by name for OpenGL driver, so the resource in different
            // stages should be declared with the same binding
            if (iter->second != binding) {
                TString errorMsg = "Invalid binding: " + name;
                infoSink.info.message(EPrefixInternalError, errorMsg.c_str());
                hasError = true;
            }
        }
    }
}